

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O3

void __thiscall Js::Profiler::Merge(Profiler *this,Profiler *profiler)

{
  long lVar1;
  TimeEntry *pTVar2;
  TimeEntry item;
  TimeEntry entry;
  TimeEntry item_00;
  undefined2 auStack_178 [4];
  undefined1 local_170 [8];
  FixedStack<Js::TimeEntry,_20> reverseStack;
  
  MergeTree(this,&this->rootNode,&profiler->rootNode);
  if (1 < (profiler->timeStack).curIndex + 1) {
    lVar1 = 8;
    do {
      *(undefined2 *)((long)auStack_178 + lVar1) = 0x176;
      *(undefined8 *)(local_170 + lVar1) = 0;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x148);
    reverseStack.itemList[0x13].time._0_4_ = -1;
    do {
      pTVar2 = FixedStack<Js::TimeEntry,_20>::Pop(&profiler->timeStack);
      item._4_4_ = 0;
      item.tag = pTVar2->tag;
      item._2_2_ = *(undefined2 *)&pTVar2->field_0x2;
      item.time = pTVar2->time;
      FixedStack<Js::TimeEntry,_20>::Push((FixedStack<Js::TimeEntry,_20> *)local_170,item);
    } while (1 < (profiler->timeStack).curIndex + 1);
    do {
      pTVar2 = FixedStack<Js::TimeEntry,_20>::Pop((FixedStack<Js::TimeEntry,_20> *)local_170);
      entry._4_4_ = 0;
      entry.tag = pTVar2->tag;
      entry._2_2_ = *(undefined2 *)&pTVar2->field_0x2;
      entry.time = pTVar2->time;
      Push(this,entry);
      item_00._4_4_ = 0;
      item_00.tag = pTVar2->tag;
      item_00._2_2_ = *(undefined2 *)&pTVar2->field_0x2;
      item_00.time = pTVar2->time;
      FixedStack<Js::TimeEntry,_20>::Push(&profiler->timeStack,item_00);
    } while ((int)reverseStack.itemList[0x13].time != -1);
  }
  return;
}

Assistant:

void
    Profiler::Merge(Profiler * profiler)
    {
        MergeTree(&rootNode, &profiler->rootNode);
        if (profiler->timeStack.Count() > 1)
        {
            FixedStack<TimeEntry, MaxStackDepth> reverseStack;
            do
            {
                reverseStack.Push(*profiler->timeStack.Pop());
            }
            while (profiler->timeStack.Count() > 1);

            do
            {
                TimeEntry * entry = reverseStack.Pop();
                this->Push(*entry);
                profiler->timeStack.Push(*entry);
            }
            while (reverseStack.Count() != 0);
        }
    }